

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sigmoid.cpp
# Opt level: O0

int test_sigmoid(Mat *a)

{
  int iVar1;
  long in_RDI;
  int ret;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  Option *this;
  undefined4 in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  undefined4 uVar2;
  size_type in_stack_fffffffffffff6a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff6b0;
  ParamDict *in_stack_fffffffffffff6d0;
  Option local_921 [13];
  _func_void_Sigmoid_ptr *in_stack_fffffffffffff908;
  float in_stack_fffffffffffff914;
  Mat *in_stack_fffffffffffff918;
  Option *in_stack_fffffffffffff920;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff928;
  ParamDict *in_stack_fffffffffffff930;
  char *in_stack_fffffffffffff938;
  
  ncnn::ParamDict::ParamDict(in_stack_fffffffffffff6d0);
  this = local_921;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1169b8);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1169d7);
  ncnn::Option::Option(this);
  uVar2 = 1;
  iVar1 = test_layer<ncnn::Sigmoid>
                    (in_stack_fffffffffffff938,in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                     in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff914,
                     in_stack_fffffffffffff908);
  if (iVar1 != 0) {
    fprintf(_stderr,"test_sigmoid failed a.dims=%d a=(%d %d %d)\n",(ulong)*(uint *)(in_RDI + 0x28),
            (ulong)*(uint *)(in_RDI + 0x2c),(ulong)*(uint *)(in_RDI + 0x30),
            (ulong)*(uint *)(in_RDI + 0x34));
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(uVar2,in_stack_fffffffffffff6a0));
  ncnn::ParamDict::~ParamDict((ParamDict *)CONCAT44(uVar2,in_stack_fffffffffffff6a0));
  return iVar1;
}

Assistant:

static int test_sigmoid(const ncnn::Mat& a)
{
    ncnn::ParamDict pd;

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Sigmoid>("Sigmoid", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_sigmoid failed a.dims=%d a=(%d %d %d)\n", a.dims, a.w, a.h, a.c);
    }

    return ret;
}